

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_SubDEdgePtr __thiscall
ON_SubDMeshFragment::SubDEdgePtr(ON_SubDMeshFragment *this,uint grid_side_index)

{
  ushort uVar1;
  ON_SubDFace *this_00;
  ON_SubDEdgePtr OVar2;
  
  this_00 = this->m_face;
  if (this_00 != (ON_SubDFace *)0x0) {
    uVar1 = this_00->m_edge_count;
    if (grid_side_index < 4 && 2 < uVar1) {
      if (this->m_face_vertex_index[grid_side_index] < uVar1) {
        OVar2 = ON_SubDFace::EdgePtr(this_00,(uint)this->m_face_vertex_index[grid_side_index]);
        return (ON_SubDEdgePtr)OVar2.m_ptr;
      }
      if (this->m_face_vertex_index[grid_side_index + 1 & 3] < uVar1) {
        OVar2 = ON_SubDFace::EdgePtr
                          (this_00,(((uint)this->m_face_vertex_index[grid_side_index + 1 & 3] +
                                    (uint)uVar1) - 1) % (uint)uVar1);
        return (ON_SubDEdgePtr)OVar2.m_ptr;
      }
    }
  }
  return (ON_SubDEdgePtr)0;
}

Assistant:

const class ON_SubDEdgePtr ON_SubDMeshFragment::SubDEdgePtr(
  unsigned int grid_side_index
  ) const
{
  const unsigned int grid_side_count = 4; // will be 3 for a tri sub-D
  if (nullptr != m_face &&  m_face->m_edge_count >= 3 && grid_side_index < grid_side_count)
  {
    unsigned short fei = m_face_vertex_index[grid_side_index];
    if (fei < m_face->m_edge_count)
      return m_face->EdgePtr(fei);
    fei = m_face_vertex_index[(grid_side_index+1) % grid_side_count];
    if (fei < m_face->m_edge_count)
      return m_face->EdgePtr((fei+m_face->m_edge_count-1) % m_face->m_edge_count);
  }
  return ON_SubDEdgePtr::Null;
}